

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_selectable_text(nk_context *ctx,char *str,int len,nk_flags align,nk_bool *value)

{
  nk_rect bounds_00;
  nk_widget_layout_states nVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  nk_bool *in_RDI;
  nk_command_buffer *in_R8;
  nk_style_selectable *in_stack_00000010;
  nk_input *in_stack_00000018;
  undefined8 in_stack_00000020;
  nk_rect bounds;
  nk_widget_layout_states state;
  nk_style *style;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  nk_bool *local_70;
  nk_rect *in_stack_ffffffffffffffb8;
  long lVar2;
  char *str_00;
  undefined4 uVar3;
  float in_stack_fffffffffffffff0;
  nk_bool local_c;
  
  uVar3 = (undefined4)((ulong)in_RSI >> 0x20);
  if ((((in_RDI == (nk_bool *)0x0) || (*(long *)(in_RDI + 0x1036) == 0)) ||
      (*(long *)(*(long *)(in_RDI + 0x1036) + 0xa8) == 0)) || (in_R8 == (nk_command_buffer *)0x0)) {
    local_c = 0;
  }
  else {
    str_00 = *(char **)(in_RDI + 0x1036);
    lVar2 = *(long *)(str_00 + 0xa8);
    nVar1 = nk_widget(in_stack_ffffffffffffffb8,(nk_context *)(in_RDI + 0x5a));
    if (nVar1 == NK_WIDGET_INVALID) {
      local_c = 0;
    }
    else {
      if ((nVar1 == NK_WIDGET_ROM) || (local_70 = in_RDI, (*(uint *)(lVar2 + 4) & 0x1000) != 0)) {
        local_70 = (nk_bool *)0x0;
      }
      bounds_00._4_8_ = in_RDI;
      bounds_00.x = (float)uVar3;
      bounds_00.h = in_stack_fffffffffffffff0;
      local_c = nk_do_selectable((nk_flags *)CONCAT44(in_EDX,in_ECX),in_R8,bounds_00,str_00,
                                 (int)((ulong)lVar2 >> 0x20),(nk_flags)lVar2,local_70,
                                 in_stack_00000010,in_stack_00000018,
                                 (nk_user_font *)in_stack_00000020);
    }
  }
  return local_c;
}

Assistant:

NK_API nk_bool
nk_selectable_text(struct nk_context *ctx, const char *str, int len,
nk_flags align, nk_bool *value)
{
struct nk_window *win;
struct nk_panel *layout;
const struct nk_input *in;
const struct nk_style *style;

enum nk_widget_layout_states state;
struct nk_rect bounds;

NK_ASSERT(ctx);
NK_ASSERT(value);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout || !value)
return 0;

win = ctx->current;
layout = win->layout;
style = &ctx->style;

state = nk_widget(&bounds, ctx);
if (!state) return 0;
in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
return nk_do_selectable(&ctx->last_widget_state, &win->buffer, bounds,
str, len, align, value, &style->selectable, in, style->font);
}